

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O2

void __thiscall
vkt::synchronization::anon_unknown_0::ShaderAccess::ComputePipeline::~ComputePipeline
          (ComputePipeline *this)

{
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__ComputePipeline_00c0a9d8;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            (&(this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  de::details::
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
  ~UniqueBase(&(this->m_indirectBuffer).
               super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
             );
  return;
}

Assistant:

ComputePipeline (OperationContext& context, const DispatchCall dispatchCall, const std::string& shaderPrefix, const VkDescriptorSetLayout descriptorSetLayout)
		: m_dispatchCall	(dispatchCall)
	{
		const DeviceInterface&	vk			= context.getDeviceInterface();
		const VkDevice			device		= context.getDevice();
		Allocator&				allocator	= context.getAllocator();

		if (m_dispatchCall == DISPATCH_CALL_DISPATCH_INDIRECT)
		{
			m_indirectBuffer = de::MovePtr<Buffer>(new Buffer(vk, device, allocator,
				makeBufferCreateInfo(sizeof(VkDispatchIndirectCommand), VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT), MemoryRequirement::HostVisible));

			const Allocation&					alloc				= m_indirectBuffer->getAllocation();
			VkDispatchIndirectCommand* const	pIndirectCommand	= static_cast<VkDispatchIndirectCommand*>(alloc.getHostPtr());

			pIndirectCommand->x	= 1u;
			pIndirectCommand->y = 1u;
			pIndirectCommand->z	= 1u;

			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), sizeof(VkDispatchIndirectCommand));
		}

		const Unique<VkShaderModule> shaderModule(createShaderModule(vk, device, context.getBinaryCollection().get(shaderPrefix + "comp"), (VkShaderModuleCreateFlags)0));

		m_pipelineLayout = makePipelineLayout(vk, device, descriptorSetLayout);
		m_pipeline		 = makeComputePipeline(vk, device, *m_pipelineLayout, *shaderModule, DE_NULL, context.getPipelineCacheData());
	}